

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

FBehavior * FBehavior::StaticLoadModule(int lumpnum,FileReader *fr,int len)

{
  bool bVar1;
  FBehavior *this;
  char *pcVar2;
  ulong uVar3;
  
  if (lumpnum == -1 && fr == (FileReader *)0x0) {
    this = (FBehavior *)0x0;
  }
  else {
    if ((ulong)StaticModules.Count != 0) {
      uVar3 = 0;
      do {
        if (StaticModules.Array[uVar3]->LumpNum == lumpnum) {
          return StaticModules.Array[uVar3];
        }
        uVar3 = uVar3 + 1;
      } while (StaticModules.Count != uVar3);
    }
    this = (FBehavior *)operator_new(0x698);
    (this->Imports).Array = (FBehavior **)0x0;
    (this->Imports).Most = 0;
    (this->Imports).Count = 0;
    (this->JumpPoints).Array = (int *)0x0;
    (this->JumpPoints).Most = 0;
    (this->JumpPoints).Count = 0;
    this->NumFunctions = 0;
    this->NumArrays = 0;
    this->NumTotalArrays = 0;
    this->Functions = (ScriptFunction *)0x0;
    this->Arrays = (ArrayInfo **)0x0;
    this->ArrayStore = (ArrayInfo *)0x0;
    this->Data = (BYTE *)0x0;
    this->Chunks = (BYTE *)0x0;
    this->Scripts = (ScriptPtr *)0x0;
    this->NumScripts = 0;
    this->Format = ACS_Unknown;
    this->LumpNum = -1;
    memset(this->MapVarStore,0,0x200);
    this->ModuleName[0] = '\0';
    this->FunctionProfileData = (ACSProfileInfo *)0x0;
    bVar1 = Init(this,lumpnum,fr,len);
    if (!bVar1) {
      ~FBehavior(this);
      operator_delete(this,0x698);
      pcVar2 = FWadCollection::GetLumpFullName(&Wads,lumpnum);
      this = (FBehavior *)0x0;
      Printf("\x1cG%s: invalid ACS module\n",pcVar2);
    }
  }
  return this;
}

Assistant:

FBehavior *FBehavior::StaticLoadModule (int lumpnum, FileReader *fr, int len)
{
	if (lumpnum == -1 && fr == NULL) return NULL;

	for (unsigned int i = 0; i < StaticModules.Size(); ++i)
	{
		if (StaticModules[i]->LumpNum == lumpnum)
		{
			return StaticModules[i];
		}
	}

	FBehavior * behavior = new FBehavior ();
	if (behavior->Init(lumpnum, fr, len))
	{
		return behavior;
	}
	else
	{
		delete behavior;
		Printf(TEXTCOLOR_RED "%s: invalid ACS module\n", Wads.GetLumpFullName(lumpnum));
		return NULL;
	}
}